

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-linux.c
# Opt level: O3

char * windows_product_name(void)

{
  int iVar1;
  uint uVar2;
  GPtrArray *pGVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 extraout_RDX;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  char *cmd_out;
  int exit_code;
  GError *error;
  char *cmd_err;
  char *local_30;
  int local_24;
  long local_20;
  undefined8 local_18;
  
  local_30 = (char *)0x0;
  local_18 = 0;
  local_20 = 0;
  iVar1 = g_spawn_command_line_sync
                    ("reg.exe query \"HKLM\\software\\microsoft\\windows nt\\currentversion\" /v ProductName"
                     ,&local_30,&local_18,&local_24);
  if (iVar1 == 0) {
    uVar7 = *(undefined8 *)(local_20 + 8);
    pcVar9 = "Error running reg.exe: %s";
  }
  else {
    if (local_24 == 0) {
      g_log("rifiuti2",0x80,"reg.exe output: %s",local_30);
      pcVar11 = "ProductName";
      uVar8 = 1;
      uVar12 = 3;
      pcVar9 = local_30;
      pGVar3 = _search_delimited_text(local_30,"ProductName","    ",1,3);
      if (pGVar3->len != 1) {
        windows_product_name_cold_1();
        pcVar4 = (char *)g_ptr_array_new_with_free_func(g_free);
        lVar5 = g_strsplit(pcVar9,"\n",0);
        uVar10 = uVar12;
        if (uVar12 < uVar8) {
          uVar10 = uVar8;
        }
        iVar1 = g_strv_length(lVar5);
        if (iVar1 != 0) {
          uVar13 = 0;
          do {
            lVar6 = g_strstr_len(*(undefined8 *)(lVar5 + uVar13 * 8),0xffffffffffffffff,pcVar11);
            if (lVar6 != 0) {
              g_log("rifiuti2",0x80,"Found potential match \'%s\' in line \'%s\'",pcVar11,
                    *(undefined8 *)(lVar5 + uVar13 * 8));
              uVar7 = g_strchomp(*(undefined8 *)(lVar5 + uVar13 * 8));
              lVar6 = g_strsplit(uVar7,extraout_RDX,0);
              uVar2 = g_strv_length(lVar6);
              if (uVar10 < uVar2) {
                iVar1 = g_strcmp0(*(undefined8 *)(lVar6 + uVar8 * 8),pcVar11);
                if (iVar1 == 0) {
                  uVar7 = g_strdup(*(undefined8 *)(lVar6 + uVar12 * 8));
                  g_ptr_array_add(pcVar4,uVar7);
                }
              }
              g_strfreev(lVar6);
            }
            uVar13 = uVar13 + 1;
            uVar2 = g_strv_length(lVar5);
          } while (uVar13 < uVar2);
        }
        g_strfreev(lVar5);
        return pcVar4;
      }
      pcVar11 = (char *)g_strdup(*pGVar3->pdata);
      g_ptr_array_free(pGVar3,1);
      goto LAB_00107279;
    }
    pcVar9 = "reg.exe error: %s";
    uVar7 = local_18;
  }
  pcVar11 = (char *)0x0;
  g_log("rifiuti2",0x80,pcVar9,uVar7);
LAB_00107279:
  g_free(local_30);
  g_free(local_18);
  g_clear_error(&local_20);
  return pcVar11;
}

Assistant:

char *
windows_product_name (void)
{
    const char *cmd = "reg.exe query \"HKLM\\software\\microsoft\\windows nt\\currentversion\" /v ProductName";
    char *cmd_out = NULL, *cmd_err = NULL, *result = NULL;
    int exit_code;
    GError *error = NULL;
    GPtrArray *search_result;

    if (FALSE == g_spawn_command_line_sync(
            cmd, &cmd_out, &cmd_err, &exit_code, &error))
    {
        g_debug ("Error running reg.exe: %s", error->message);
        goto prod_cleanup;
    }

    if (exit_code != 0)
    {
        g_debug ("reg.exe error: %s", cmd_err);
        goto prod_cleanup;
    }

    g_debug ("reg.exe output: %s", cmd_out);

    search_result = _search_delimited_text (
        (const char *)cmd_out, "ProductName", "    ", 1, 3);
    g_assert (search_result->len == 1);
    result = g_strdup ((char *) (search_result->pdata[0]));
    g_ptr_array_free (search_result, TRUE);

    prod_cleanup:

    g_free (cmd_out);
    g_free (cmd_err);
    g_clear_error (&error);
    return result;
}